

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

void __thiscall Parsing::File::parseExt(File *this,string *s)

{
  pointer pcVar1;
  long lVar2;
  string asStack_38 [32];
  
  lVar2 = std::__cxx11::string::find((char *)s,0x108150);
  if (lVar2 == -1) {
    (this->_ext)._M_string_length = 0;
    *(this->_ext)._M_dataplus._M_p = '\0';
  }
  pcVar1 = (s->_M_dataplus)._M_p;
  std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (pcVar1,pcVar1 + s->_M_string_length);
  std::__cxx11::string::find_first_of((char *)s,0x108150);
  std::__cxx11::string::substr((ulong)asStack_38,(ulong)s);
  std::__cxx11::string::operator=((string *)s,asStack_38);
  std::__cxx11::string::~string(asStack_38);
  pcVar1 = (s->_M_dataplus)._M_p;
  std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (pcVar1,pcVar1 + s->_M_string_length);
  std::__cxx11::string::_M_assign((string *)this);
  return;
}

Assistant:

void File::parseExt(std::string s)
    {
        if (s.find(".") == std::string::npos)
            _ext.clear();

        std::reverse(s.begin(), s.end());

        s = s.substr(0, s.find_first_of("."));
        std::reverse(s.begin(), s.end());
        _ext = s;
    }